

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arange.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  float *pfVar9;
  char *pcVar10;
  undefined4 in_register_0000003c;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar11;
  undefined8 uVar12;
  undefined4 uStack_40;
  undefined7 uStack_37;
  
  iVar2 = ggml_tensor_overhead(CONCAT44(in_register_0000003c,param_1));
  iVar2 = iVar2 * 2 + 0x200000;
  uVar3 = ggml_backend_cpu_init();
  uVar12 = CONCAT71(uStack_37,1);
  uStack_40 = 0;
  uVar4 = ggml_init();
  lVar5 = ggml_arange(0,0x40400000,0x3f800000,uVar4);
  if (*(long *)(lVar5 + 0x10) == 3) {
    uVar6 = ggml_backend_get_default_buffer_type(uVar3);
    uVar6 = ggml_gallocr_new(uVar6);
    uVar7 = ggml_new_graph(uVar4);
    ggml_build_forward_expand(uVar7,lVar5);
    ggml_gallocr_alloc_graph(uVar6,uVar7);
    cVar1 = ggml_backend_is_cpu(uVar3);
    if (cVar1 != '\0') {
      ggml_backend_cpu_set_n_threads(uVar3,4);
    }
    ggml_backend_graph_compute(uVar3,uVar7);
    uVar8 = ggml_nelements();
    pfVar9 = (float *)operator_new__(-(ulong)(uVar8 >> 0x3e != 0) | uVar8 * 4);
    uVar7 = ggml_nbytes(lVar5);
    ggml_backend_tensor_get(lVar5,pfVar9,0,uVar7);
    if (0 < *(long *)(lVar5 + 0x10)) {
      lVar11 = 0;
      do {
        printf("%.2f ",SUB84((double)pfVar9[lVar11],0));
        lVar11 = lVar11 + 1;
      } while (lVar11 < *(long *)(lVar5 + 0x10));
    }
    putchar(10);
    if ((*pfVar9 != 0.0) || (NAN(*pfVar9))) {
      pcVar10 = "output[0] == 0";
      uVar3 = 0x59;
    }
    else if ((pfVar9[1] != 1.0) || (NAN(pfVar9[1]))) {
      pcVar10 = "output[1] == 1";
      uVar3 = 0x5a;
    }
    else {
      if ((pfVar9[2] == 2.0) && (!NAN(pfVar9[2]))) {
        operator_delete__(pfVar9);
        ggml_free(uVar4);
        ggml_gallocr_free(uVar6);
        ggml_backend_free(uVar3);
        return 0;
      }
      pcVar10 = "output[2] == 2";
      uVar3 = 0x5b;
    }
  }
  else {
    pcVar10 = "t->ne[0] == 3";
    uVar3 = 0x3f;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-arange.cpp"
             ,uVar3,"GGML_ASSERT(%s) failed",pcVar10,in_R8,in_R9,iVar2,uStack_40,uVar12);
  halt_baddata();
}

Assistant:

int main(int /*argc*/, const char** /*argv*/) {
    {
        bool use_gpu = true;
        GGML_UNUSED(use_gpu);

        ggml_backend_t backend = NULL;
        //ggml_backend_buffer_t buffer;

        #ifdef GGML_USE_CUDA
        if (use_gpu) {
            fprintf(stderr, "%s: using CUDA backend\n", __func__);
            backend = ggml_backend_cuda_init(0);
            if (!backend) {
                fprintf(stderr, "%s: ggml_backend_cuda_init() failed\n", __func__);
            }
        }
        #endif

        #ifdef GGML_USE_METAL
        if (!backend) {
            fprintf(stderr, "%s: using Metal backend\n", __func__);
            backend = ggml_backend_metal_init();
            if (!backend) {
                fprintf(stderr, "%s: ggml_backend_metal_init() failed\n", __func__);
            }
        }
        #endif

        const int num_tensors = 2;

        struct ggml_init_params params = {
                /*.mem_size   =*/ ggml_tensor_overhead() * num_tensors + 2 * 1024 * 1024,
                /*.mem_size   =*/ NULL,
                /*.mem_size   =*/ true,
        };

        if (!backend) {
            // fallback to CPU backend
            backend = ggml_backend_cpu_init();
        }

        // create context
        struct ggml_context* ctx = ggml_init(params);
        struct ggml_tensor * t = ggml_arange(ctx, 0, 3, 1);

        GGML_ASSERT(t->ne[0] == 3);

        ggml_gallocr_t galloc = ggml_gallocr_new(ggml_backend_get_default_buffer_type(backend));

        struct ggml_cgraph * graph = ggml_new_graph(ctx);
        ggml_build_forward_expand(graph, t);

        // allocate tensors
        ggml_gallocr_alloc_graph(galloc, graph);

        int n_threads = 4;

        if (ggml_backend_is_cpu(backend)) {
            ggml_backend_cpu_set_n_threads(backend, n_threads);
        }

        ggml_backend_graph_compute(backend, graph);

        float * output = new float[ggml_nelements(t)];
        ggml_backend_tensor_get(t, output, 0, ggml_nbytes(t));

        for (int i = 0; i < t->ne[0]; i++) {
            printf("%.2f ", output[i]);
        }
        printf("\n");

        GGML_ASSERT(output[0] == 0);
        GGML_ASSERT(output[1] == 1);
        GGML_ASSERT(output[2] == 2);

        delete[] output;
        ggml_free(ctx);
        ggml_gallocr_free(galloc);
        ggml_backend_free(backend);
    }

    return 0;
}